

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.cc
# Opt level: O0

int32 __thiscall
IdSetLexicon::AddInternal(IdSetLexicon *this,vector<int,_std::allocator<int>_> *ids)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  uint *puVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  const_iterator local_58;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator local_38;
  int *local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *ids_local;
  IdSetLexicon *this_local;
  
  local_20 = ids;
  ids_local = (vector<int,_std::allocator<int>_> *)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(ids);
  if (bVar1) {
    this_local._4_4_ = 0x80000000;
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_20);
    if (sVar3 == 1) {
      puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_20,0);
      this_local._4_4_ = *puVar4;
    }
    else {
      local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_20);
      local_30 = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_28,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          local_30);
      this_00 = local_20;
      local_48._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_20);
      local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
      local_40 = std::
                 unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                           (local_48,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_50);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_38,
                 &local_40);
      local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_58,
                 &local_60);
      std::vector<int,_std::allocator<int>_>::erase(this_00,local_38,local_58);
      uVar2 = SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::
              Add<std::vector<int,std::allocator<int>>>
                        ((SequenceLexicon<int,std::hash<int>,std::equal_to<int>> *)this,local_20);
      this_local._4_4_ = uVar2 ^ 0xffffffff;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32 IdSetLexicon::AddInternal(std::vector<int32>* ids) {
  if (ids->empty()) {
    // Empty sets have a special id chosen not to conflict with other ids.
    return kEmptySetId;
  } else if (ids->size() == 1) {
    // Singleton sets are represented by their element.
    return (*ids)[0];
  } else {
    // Canonicalize the set by sorting and removing duplicates.
    std::sort(ids->begin(), ids->end());
    ids->erase(std::unique(ids->begin(), ids->end()), ids->end());
    // Non-singleton sets are represented by the bitwise complement of the id
    // returned by SequenceLexicon.
    return ~id_sets_.Add(*ids);
  }
}